

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_device.c
# Opt level: O0

int amqp_device_delayed_stop(AMQP_DEVICE_HANDLE handle,size_t delay_secs)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  AMQP_DEVICE_INSTANCE_conflict *instance;
  LOGGER_LOG l;
  int result;
  size_t delay_secs_local;
  AMQP_DEVICE_HANDLE handle_local;
  
  if (handle == (AMQP_DEVICE_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                ,"amqp_device_delayed_stop",0x38a,1,"Failed stopping device (handle is NULL)");
    }
    l._4_4_ = 0x38b;
  }
  else if ((handle->state == DEVICE_STATE_STOPPED) || (handle->state == DEVICE_STATE_STOPPING)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                ,"amqp_device_delayed_stop",0x393,1,
                "Failed stopping device \'%s\' (device is already stopped or stopping)",
                handle->config->device_id);
    }
    l._4_4_ = 0x394;
  }
  else {
    iVar1 = tickcounter_get_current_ms(handle->tick_counter_handle,&handle->last_stop_request_time);
    if (iVar1 == 0) {
      update_state(handle,DEVICE_STATE_STOPPING);
      handle->stop_delay_ms = delay_secs * 1000;
      l._4_4_ = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                  ,"amqp_device_delayed_stop",0x398,1,
                  "Failed stopping device \'%s\' (could not get tickcounter time)",
                  handle->config->device_id);
      }
      l._4_4_ = 0x399;
    }
  }
  return l._4_4_;
}

Assistant:

int amqp_device_delayed_stop(AMQP_DEVICE_HANDLE handle, size_t delay_secs)
{
    int result;

    if (handle == NULL)
    {
        LogError("Failed stopping device (handle is NULL)");
        result = MU_FAILURE;
    }
    else
    {
        AMQP_DEVICE_INSTANCE* instance = (AMQP_DEVICE_INSTANCE*)handle;

        if (instance->state == DEVICE_STATE_STOPPED || instance->state == DEVICE_STATE_STOPPING)
        {
            LogError("Failed stopping device '%s' (device is already stopped or stopping)", instance->config->device_id);
            result = MU_FAILURE;
        }
        else if (tickcounter_get_current_ms(instance->tick_counter_handle, &instance->last_stop_request_time) != 0)
        {
            LogError("Failed stopping device '%s' (could not get tickcounter time)", instance->config->device_id);
            result = MU_FAILURE;
        }
        else
        {
            update_state(instance, DEVICE_STATE_STOPPING);
            instance->stop_delay_ms = delay_secs * 1000;
            result = RESULT_OK;
        }
    }

    return result;
}